

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O2

void world_recover(void *world_void)

{
  Character *character;
  int iVar1;
  mapped_type *pmVar2;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this;
  int *piVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  double dVar6;
  allocator<char> local_71;
  double local_70;
  undefined8 *local_68;
  PacketBuilder builder;
  
  puVar5 = *(undefined8 **)((long)world_void + 0x498);
  puVar4 = *(undefined8 **)((long)world_void + 0x4a0);
  this = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
          *)((long)world_void + 0x198);
  local_68 = puVar4;
  do {
    if (puVar5 == puVar4) {
      return;
    }
    character = (Character *)*puVar5;
    if (character->hp == character->maxhp) {
      iVar1 = character->maxtp;
      if (character->tp != iVar1) {
LAB_00176ca9:
        piVar3 = &character->tp;
        local_70 = (double)iVar1;
        if (character->sitting == SIT_STAND) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&builder,"TPRecoverRate",&local_71);
          pmVar2 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[](this,(key_type *)&builder);
          dVar6 = util::variant::GetFloat(pmVar2);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&builder,"SitTPRecoverRate",&local_71);
          pmVar2 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[](this,(key_type *)&builder);
          dVar6 = util::variant::GetFloat(pmVar2);
        }
        *piVar3 = (int)(local_70 * dVar6 + (double)*piVar3);
        std::__cxx11::string::~string((string *)&builder);
        iVar1 = *piVar3;
        if (character->maxtp < *piVar3) {
          iVar1 = character->maxtp;
        }
        *piVar3 = iVar1;
        puVar4 = local_68;
        goto LAB_00176d4d;
      }
    }
    else {
      local_70 = (double)character->maxhp;
      if (character->sitting == SIT_STAND) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&builder,"HPRecoverRate",&local_71);
        pmVar2 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[](this,(key_type *)&builder);
        dVar6 = util::variant::GetFloat(pmVar2);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&builder,"SitHPRecoverRate",&local_71);
        pmVar2 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[](this,(key_type *)&builder);
        dVar6 = util::variant::GetFloat(pmVar2);
      }
      character->hp = (int)(local_70 * dVar6 + (double)character->hp);
      std::__cxx11::string::~string((string *)&builder);
      iVar1 = character->hp;
      if (character->maxhp < character->hp) {
        iVar1 = character->maxhp;
      }
      character->hp = iVar1;
      if (character->party != (Party *)0x0) {
        Party::UpdateHP(character->party,character);
      }
      iVar1 = character->maxtp;
      if (character->tp != iVar1) goto LAB_00176ca9;
LAB_00176d4d:
      PacketBuilder::PacketBuilder(&builder,PACKET_RECOVER,PACKET_PLAYER,6);
      PacketBuilder::AddShort(&builder,character->hp);
      PacketBuilder::AddShort(&builder,character->tp);
      PacketBuilder::AddShort(&builder,0);
      Character::Send(character,&builder);
      PacketBuilder::~PacketBuilder(&builder);
    }
    puVar5 = puVar5 + 1;
  } while( true );
}

Assistant:

void world_recover(void *world_void)
{
	World *world(static_cast<World *>(world_void));

	UTIL_FOREACH(world->characters, character)
	{
		bool updated = false;

		if (character->hp != character->maxhp)
		{
			if (character->sitting != SIT_STAND) character->hp += character->maxhp * double(world->config["SitHPRecoverRate"]);
			else                                 character->hp += character->maxhp * double(world->config["HPRecoverRate"]);

			character->hp = std::min(character->hp, character->maxhp);
			updated = true;

			if (character->party)
			{
				character->party->UpdateHP(character);
			}
		}

		if (character->tp != character->maxtp)
		{
			if (character->sitting != SIT_STAND) character->tp += character->maxtp * double(world->config["SitTPRecoverRate"]);
			else                                 character->tp += character->maxtp * double(world->config["TPRecoverRate"]);

			character->tp = std::min(character->tp, character->maxtp);
			updated = true;
		}

		if (updated)
		{
			PacketBuilder builder(PACKET_RECOVER, PACKET_PLAYER, 6);
			builder.AddShort(character->hp);
			builder.AddShort(character->tp);
			builder.AddShort(0); // ?
			character->Send(builder);
		}
	}
}